

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

uint aom_avg_8x8_sse2(uint8_t *s,int p)

{
  longlong in_RDX;
  int iVar1;
  longlong in_RSI;
  long in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i s_00;
  __m128i s_01;
  __m128i s_02;
  __m128i s_03;
  uint avg;
  __m128i u0;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  __m128i sum1;
  __m128i sum0;
  undefined2 local_68;
  undefined2 uStack_66;
  undefined2 uStack_60;
  undefined2 uStack_5e;
  undefined2 local_58;
  undefined2 uStack_56;
  undefined2 uStack_50;
  undefined2 uStack_4e;
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_40;
  undefined2 uStack_3e;
  undefined2 local_38;
  undefined2 uStack_36;
  undefined2 uStack_30;
  undefined2 uStack_2e;
  
  iVar1 = (int)in_RSI;
  s_00[1] = in_RDX;
  s_00[0] = in_RSI;
  loadh_epi64((void *)(in_RDI + iVar1),s_00);
  s_01[1] = (long)(iVar1 * 3);
  s_01[0] = in_RSI;
  loadh_epi64((void *)(in_RDI + s_01[1]),s_01);
  s_02[1] = (long)(iVar1 * 5);
  s_02[0] = in_RSI;
  loadh_epi64((void *)(in_RDI + s_02[1]),s_02);
  s_03[1]._0_4_ = iVar1 * 2;
  s_03[0] = in_RSI;
  s_03[1]._4_4_ = 0;
  loadh_epi64((void *)(in_RDI + iVar1 * 7),s_03);
  auVar2._8_8_ = extraout_XMM0_Qb;
  auVar2._0_8_ = extraout_XMM0_Qa;
  auVar2 = psadbw(auVar2,ZEXT816(0));
  auVar3._8_8_ = extraout_XMM0_Qb_00;
  auVar3._0_8_ = extraout_XMM0_Qa_00;
  auVar3 = psadbw(auVar3,ZEXT816(0));
  auVar4._8_8_ = extraout_XMM0_Qb_01;
  auVar4._0_8_ = extraout_XMM0_Qa_01;
  auVar4 = psadbw(auVar4,ZEXT816(0));
  auVar5._8_8_ = extraout_XMM0_Qb_02;
  auVar5._0_8_ = extraout_XMM0_Qa_02;
  auVar5 = psadbw(auVar5,ZEXT816(0));
  local_38 = auVar2._0_2_;
  uStack_36 = auVar2._2_2_;
  uStack_30 = auVar2._8_2_;
  uStack_2e = auVar2._10_2_;
  local_48 = auVar3._0_2_;
  uStack_46 = auVar3._2_2_;
  uStack_40 = auVar3._8_2_;
  uStack_3e = auVar3._10_2_;
  local_58 = auVar4._0_2_;
  uStack_56 = auVar4._2_2_;
  uStack_50 = auVar4._8_2_;
  uStack_4e = auVar4._10_2_;
  local_68 = auVar5._0_2_;
  uStack_66 = auVar5._2_2_;
  uStack_60 = auVar5._8_2_;
  uStack_5e = auVar5._10_2_;
  return CONCAT22(uStack_36 + uStack_46 + uStack_56 + uStack_66 +
                  uStack_2e + uStack_3e + uStack_4e + uStack_5e,
                  local_38 + local_48 + local_58 + local_68 +
                  uStack_30 + uStack_40 + uStack_50 + uStack_60) + 0x20U >> 6;
}

Assistant:

unsigned int aom_avg_8x8_sse2(const uint8_t *s, int p) {
  __m128i sum0, sum1, s0, s1, s2, s3, u0;
  unsigned int avg = 0;
  u0 = _mm_setzero_si128();
  s0 = loadh_epi64((const __m128i *)(s + p),
                   _mm_loadl_epi64((const __m128i *)(s)));
  s1 = loadh_epi64((const __m128i *)(s + 3 * p),
                   _mm_loadl_epi64((const __m128i *)(s + 2 * p)));
  s2 = loadh_epi64((const __m128i *)(s + 5 * p),
                   _mm_loadl_epi64((const __m128i *)(s + 4 * p)));
  s3 = loadh_epi64((const __m128i *)(s + 7 * p),
                   _mm_loadl_epi64((const __m128i *)(s + 6 * p)));
  s0 = _mm_sad_epu8(s0, u0);
  s1 = _mm_sad_epu8(s1, u0);
  s2 = _mm_sad_epu8(s2, u0);
  s3 = _mm_sad_epu8(s3, u0);

  sum0 = _mm_add_epi16(s0, s1);
  sum1 = _mm_add_epi16(s2, s3);
  sum0 = _mm_add_epi16(sum0, sum1);
  sum0 = _mm_add_epi16(sum0, _mm_srli_si128(sum0, 8));
  avg = _mm_cvtsi128_si32(sum0);
  return (avg + 32) >> 6;
}